

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O2

int save_load_flat_example(io_buf *model_file,bool read,flat_example **fec)

{
  features *this;
  float *data;
  unsigned_long *data_00;
  flat_example *pfVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  ostream *poVar5;
  ulong uVar6;
  undefined7 in_register_00000031;
  features *fs;
  
  if ((int)CONCAT71(in_register_00000031,read) == 0) {
    sVar2 = io_buf::bin_write_fixed(model_file,(char *)*fec,200);
    if (sVar2 == 0) {
      return 1;
    }
    pfVar1 = *fec;
    if (pfVar1->tag_len != 0) {
      sVar2 = io_buf::bin_write_fixed(model_file,pfVar1->tag,pfVar1->tag_len & 0xffffffff);
      pfVar1 = *fec;
      if (sVar2 == 0) {
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        poVar5 = std::operator<<(poVar5," ");
        poVar5 = std::operator<<(poVar5,(*fec)->tag);
        std::endl<char,std::char_traits<char>>(poVar5);
        return 2;
      }
    }
    data = (pfVar1->fs).values._begin;
    uVar6 = (long)(pfVar1->fs).values._end - (long)data;
    if (uVar6 != 0) {
      sVar2 = io_buf::bin_write_fixed(model_file,(char *)data,uVar6 & 0x3fffffffc);
      if (sVar2 == 0) {
        return 3;
      }
      data_00 = ((*fec)->fs).indicies._begin;
      sVar2 = io_buf::bin_write_fixed
                        (model_file,(char *)data_00,
                         (long)((*fec)->fs).indicies._end - (long)data_00 & 0x7fffffff8);
      if (sVar2 == 0) {
        return 3;
      }
    }
  }
  else {
    pfVar1 = calloc_or_throw<flat_example>();
    *fec = pfVar1;
    sVar2 = io_buf::bin_read_fixed(model_file,(char *)pfVar1,200,"");
    if (sVar2 == 0) {
      return 1;
    }
    pfVar1 = *fec;
    if (pfVar1->tag_len != 0) {
      pcVar3 = calloc_or_throw<char>(pfVar1->tag_len);
      (*fec)->tag = pcVar3;
      sVar2 = io_buf::bin_read_fixed(model_file,(*fec)->tag,(*fec)->tag_len,"");
      if (sVar2 == 0) {
        return 2;
      }
      pfVar1 = *fec;
    }
    sVar2 = (long)(pfVar1->fs).values._end - (long)(pfVar1->fs).values._begin;
    if (sVar2 != 0) {
      this = &pfVar1->fs;
      (pfVar1->fs).values.end_array = (float *)0x0;
      (pfVar1->fs).values.erase_count = 0;
      (this->values)._begin = (float *)0x0;
      (pfVar1->fs).values._end = (float *)0x0;
      v_array<float>::resize(&this->values,(long)sVar2 >> 2);
      sVar4 = io_buf::bin_read_fixed(model_file,(char *)(this->values)._begin,sVar2,"");
      if (sVar4 == 0) {
        return 3;
      }
      (pfVar1->fs).values._end = (float *)(sVar2 + (long)(pfVar1->fs).values._begin);
      sVar4 = (long)(pfVar1->fs).indicies._end - (long)(pfVar1->fs).indicies._begin;
      (pfVar1->fs).indicies.end_array = (unsigned_long *)0x0;
      (pfVar1->fs).indicies.erase_count = 0;
      (pfVar1->fs).indicies._begin = (unsigned_long *)0x0;
      (pfVar1->fs).indicies._end = (unsigned_long *)0x0;
      v_array<unsigned_long>::resize(&(pfVar1->fs).indicies,(long)sVar4 >> 3);
      sVar2 = io_buf::bin_read_fixed(model_file,(char *)(pfVar1->fs).indicies._begin,sVar4,"");
      if (sVar2 == 0) {
        return 3;
      }
      (pfVar1->fs).indicies._end = (unsigned_long *)(sVar4 + (long)(pfVar1->fs).indicies._begin);
    }
  }
  return 0;
}

Assistant:

int save_load_flat_example(io_buf& model_file, bool read, flat_example*& fec)
{
  size_t brw = 1;
  if (read)
  {
    fec = &calloc_or_throw<flat_example>();
    brw = model_file.bin_read_fixed((char*)fec, sizeof(flat_example), "");

    if (brw > 0)
    {
      if (fec->tag_len > 0)
      {
        fec->tag = calloc_or_throw<char>(fec->tag_len);
        brw = model_file.bin_read_fixed((char*)fec->tag, fec->tag_len * sizeof(char), "");
        if (!brw)
          return 2;
      }
      if (fec->fs.size() > 0)
      {
        features& fs = fec->fs;
        size_t len = fs.size();
        fs.values = v_init<feature_value>();
        fs.values.resize(len);
        brw = model_file.bin_read_fixed((char*)fs.values.begin(), len * sizeof(feature_value), "");
        if (!brw)
          return 3;
        fs.values.end() = fs.values.begin() + len;

        len = fs.indicies.size();
        fs.indicies = v_init<feature_index>();
        fs.indicies.resize(len);
        brw = model_file.bin_read_fixed((char*)fs.indicies.begin(), len * sizeof(feature_index), "");
        if (!brw)
          return 3;
        fs.indicies.end() = fs.indicies.begin() + len;
      }
    }
    else
      return 1;
  }
  else
  {
    brw = model_file.bin_write_fixed((char*)fec, sizeof(flat_example));

    if (brw > 0)
    {
      if (fec->tag_len > 0)
      {
        brw = model_file.bin_write_fixed((char*)fec->tag, (uint32_t)fec->tag_len * sizeof(char));
        if (!brw)
        {
          cerr << fec->tag_len << " " << fec->tag << endl;
          return 2;
        }
      }
      if (fec->fs.size() > 0)
      {
        brw =
            model_file.bin_write_fixed((char*)fec->fs.values.begin(), (uint32_t)fec->fs.size() * sizeof(feature_value));
        if (!brw)
          return 3;
        brw = model_file.bin_write_fixed(
            (char*)fec->fs.indicies.begin(), (uint32_t)fec->fs.indicies.size() * sizeof(feature_index));
        if (!brw)
          return 3;
      }
    }
    else
      return 1;
  }
  return 0;
}